

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O1

uint8_t MatchSorted(Size size)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  
  if (0x217 < size) {
    uVar1 = 0x3f;
    if (size != 0) {
      for (; size >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar2 = (int)(uVar1 ^ 0x3f) * -4 + 0xd8;
    bVar3 = 0x3f;
    if (uVar2 < 0x40) {
      bVar3 = (byte)(size >> (0x3dU - (char)(uVar1 ^ 0x3f) & 0x3f)) & 3 | (byte)uVar2;
    }
    return bVar3;
  }
  __assert_fail("size >= NOT_EXACT_MIN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,199,"uint8_t MatchSorted(Size)");
}

Assistant:

static uint8_t MatchSorted(Size size) {
    assert(size >= NOT_EXACT_MIN);
#ifndef __GNUC__
#error "GCC builtin is used."
#endif
    unsigned mostSigBitIndex =
            (unsigned) sizeof(Size) * 8 - __builtin_clzl(size) - 1;
    assert(mostSigBitIndex >= 9);
    if (((mostSigBitIndex - 9) << 2u) >= 64) {
        return 63;
    }
    return ((mostSigBitIndex - 9) << 2u) |
           ((size >> (mostSigBitIndex - 2u)) & 0x03u);
}